

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

Instr * __thiscall FlowGraph::PeepCm(FlowGraph *this,Instr *instr)

{
  byte bVar1;
  OpCode OVar2;
  uint32 origBranchSrcSymId;
  Func *func;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  OpCode OVar6;
  int iVar7;
  RegSlot RVar8;
  uint32 uVar9;
  uint32 uVar10;
  Instr *this_00;
  Instr *pIVar11;
  Instr *pIVar12;
  StackSym *pSVar13;
  Opnd *pOVar14;
  undefined4 *puVar15;
  undefined4 extraout_var;
  AddrOpnd *this_01;
  undefined4 extraout_var_00;
  AddrOpnd *this_02;
  RegOpnd *pRVar16;
  Instr *pIVar17;
  BranchInstr *pBVar18;
  Instr *this_03;
  LabelInstr *labelInstr;
  AddrOpnd *newSrc;
  AddrOpnd *src1Opnd;
  Instr *inlineeEndInstr;
  undefined1 local_b8 [8];
  AutoReuseOpnd brSrcAutoCopy;
  Func *local_88;
  Instr *local_68;
  Instr *local_58;
  uint32 local_4c;
  Opnd *local_40;
  
  func = instr->m_func;
  this_00 = IR::Instr::GetNextRealInstrOrLabel(instr);
  local_40 = instr->m_dst;
  if ((this_00->m_opcode == Ld_A) && (bVar4 = IR::Opnd::IsEqual(this_00->m_src1,local_40), bVar4)) {
    local_40 = this_00->m_dst;
    bVar4 = IR::Opnd::IsEqual(local_40,instr->m_src1);
    if (bVar4) {
      return (Instr *)0x0;
    }
    bVar4 = IR::Opnd::IsEqual(local_40,instr->m_src2);
    if (bVar4) {
      return (Instr *)0x0;
    }
    pIVar11 = IR::Instr::GetNextRealInstrOrLabel(this_00);
    local_58 = this_00;
    if ((pIVar11->m_opcode == Ld_A) && (bVar4 = IR::Opnd::IsEqual(pIVar11->m_src1,local_40), bVar4))
    {
      local_40 = pIVar11->m_dst;
      pIVar12 = IR::Instr::GetNextRealInstrOrLabel(pIVar11);
      bVar4 = IR::Opnd::IsEqual(local_40,instr->m_src1);
      if (bVar4) {
        return (Instr *)0x0;
      }
      bVar4 = true;
      bVar5 = IR::Opnd::IsEqual(local_40,instr->m_src2);
      pIVar17 = pIVar11;
      if (bVar5) {
        return (Instr *)0x0;
      }
    }
    else {
      bVar4 = true;
      pIVar17 = (Instr *)0x0;
      pIVar12 = pIVar11;
    }
  }
  else {
    bVar4 = false;
    pIVar17 = (Instr *)0x0;
    local_58 = (Instr *)0x0;
    pIVar12 = this_00;
  }
  OVar2 = pIVar12->m_opcode;
  if (OVar2 == InlineeEnd) {
    pIVar11 = IR::Instr::GetNextRealInstrOrLabel(pIVar12);
    OVar2 = pIVar11->m_opcode;
    local_68 = pIVar12;
  }
  else {
    local_68 = (Instr *)0x0;
    pIVar11 = pIVar12;
  }
  if (((OVar2 & ~ExtendedOpcodePrefix) != BrFalse_A) ||
     ((bVar5 = IR::Opnd::IsEqual(instr->m_dst,pIVar11->m_src1), !bVar5 &&
      (bVar5 = IR::Opnd::IsEqual(local_40,pIVar11->m_src1), !bVar5)))) {
    return (Instr *)0x0;
  }
  local_88 = pIVar11->m_func;
  local_4c = IR::Instr::GetByteCodeOffset(pIVar11);
  pSVar13 = IR::Opnd::GetStackSym(pIVar11->m_src1);
  origBranchSrcSymId = (pSVar13->super_Sym).m_id;
  bVar1 = pIVar11->m_src1->field_0xb;
  IR::Instr::Unlink(pIVar11);
  IR::Instr::InsertBefore(instr,pIVar11);
  IR::Instr::ClearByteCodeOffset(pIVar11);
  IR::Instr::SetByteCodeOffset(pIVar11,instr);
  IR::Instr::FreeSrc1(pIVar11);
  pOVar14 = IR::Instr::UnlinkSrc1(instr);
  IR::Instr::SetSrc1(pIVar11,pOVar14);
  pOVar14 = IR::Instr::UnlinkSrc2(instr);
  IR::Instr::SetSrc2(pIVar11,pOVar14);
  pIVar11->m_func = instr->m_func;
  switch(instr->m_opcode) {
  case CmEq_A:
    OVar6 = BrEq_A;
    break;
  case CmGe_A:
    OVar6 = BrGe_A;
    break;
  case CmGt_A:
    OVar6 = BrGt_A;
    break;
  case CmLt_A:
    OVar6 = BrLt_A;
    break;
  case CmLe_A:
    OVar6 = BrLe_A;
    break;
  case CmNeq_A:
    OVar6 = BrNeq_A;
    break;
  case CmSrEq_A:
    OVar6 = BrSrEq_A;
    break;
  case CmSrNeq_A:
    OVar6 = BrSrNeq_A;
    break;
  default:
    switch(instr->m_opcode) {
    case CmUnGe_A:
      OVar6 = BrUnGe_A;
      break;
    case CmUnGt_A:
      OVar6 = BrUnGt_A;
      break;
    case CmUnLt_A:
      OVar6 = BrUnLt_A;
      break;
    case CmUnLe_A:
      OVar6 = BrUnLe_A;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar15 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xb20,"((0))","UNREACHED");
      if (!bVar5) goto LAB_003f9f4d;
      *puVar15 = 0;
      OVar6 = InvalidOpCode;
    }
  }
  pIVar11->m_opcode = OVar6;
  brSrcAutoCopy._16_8_ = pIVar11;
  iVar7 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[2])();
  this_01 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar7),AddrOpndKindDynamicVar,func,true,(Var)0x0
                             );
  iVar7 = (*func->m_scriptContextInfo->_vptr_ScriptContextInfo[3])();
  this_02 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar7),AddrOpndKindDynamicVar,func,true,
                              (Var)0x0);
  IR::Opnd::SetValueType(&this_01->super_Opnd,(ValueType)0x400);
  IR::Opnd::SetValueType(&this_02->super_Opnd,(ValueType)0x400);
  pIVar12 = (Instr *)brSrcAutoCopy._16_8_;
  if (OVar2 == BrTrue_A) {
    if (bVar4) {
      pIVar11 = IR::Instr::New(Ld_A,local_58->m_src1,&this_01->super_Opnd,
                               *(Func **)(brSrcAutoCopy._16_8_ + 0x20));
      IR::Instr::SetByteCodeOffset(pIVar11,pIVar12);
      pRVar16 = IR::Opnd::AsRegOpnd(pIVar11->m_dst);
      pRVar16->field_0x18 = pRVar16->field_0x18 | 8;
      IR::Instr::InsertBefore(pIVar12,pIVar11);
      pIVar11 = IR::Instr::New(Ld_A,local_58->m_dst,&this_01->super_Opnd,
                               *(Func **)((long)pIVar12 + 0x20));
      IR::Instr::SetByteCodeOffset(pIVar11,pIVar12);
      pRVar16 = IR::Opnd::AsRegOpnd(pIVar11->m_dst);
      pRVar16->field_0x18 = pRVar16->field_0x18 | 8;
      IR::Instr::InsertBefore(pIVar12,pIVar11);
      pIVar11 = IR::Instr::New(Ld_A,local_58->m_src1,&this_02->super_Opnd,local_58->m_func);
      IR::Instr::InsertBefore(local_58,pIVar11);
      IR::Instr::SetByteCodeOffset(pIVar11,local_58);
      pRVar16 = IR::Opnd::AsRegOpnd(pIVar11->m_dst);
      pRVar16->field_0x18 = pRVar16->field_0x18 | 8;
      IR::Instr::ReplaceSrc1(local_58,&this_02->super_Opnd);
      newSrc = this_02;
      src1Opnd = this_01;
LAB_003f9b98:
      if (pIVar17 != (Instr *)0x0) {
        IR::Instr::ReplaceSrc1(pIVar17,&newSrc->super_Opnd);
        pIVar17 = IR::Instr::New(Ld_A,pIVar17->m_dst,&src1Opnd->super_Opnd,
                                 *(Func **)((long)pIVar12 + 0x20));
        IR::Instr::InsertBefore(pIVar12,pIVar17);
        IR::Instr::SetByteCodeOffset(pIVar17,pIVar12);
        pRVar16 = IR::Opnd::AsRegOpnd(pIVar17->m_dst);
        pRVar16->field_0x18 = pRVar16->field_0x18 | 8;
      }
    }
  }
  else {
    pBVar18 = IR::Instr::AsBranchInstr((Instr *)brSrcAutoCopy._16_8_);
    IR::BranchInstr::Invert(pBVar18);
    if (bVar4) {
      pIVar11 = IR::Instr::New(Ld_A,local_58->m_src1,&this_02->super_Opnd,
                               *(Func **)((long)pIVar12 + 0x20));
      IR::Instr::InsertBefore(pIVar12,pIVar11);
      IR::Instr::SetByteCodeOffset(pIVar11,pIVar12);
      pRVar16 = IR::Opnd::AsRegOpnd(pIVar11->m_dst);
      pRVar16->field_0x18 = pRVar16->field_0x18 | 8;
      pIVar11 = IR::Instr::New(Ld_A,local_58->m_dst,&this_02->super_Opnd,
                               *(Func **)((long)pIVar12 + 0x20));
      IR::Instr::InsertBefore(pIVar12,pIVar11);
      IR::Instr::SetByteCodeOffset(pIVar11,pIVar12);
      pRVar16 = IR::Opnd::AsRegOpnd(pIVar11->m_dst);
      pRVar16->field_0x18 = pRVar16->field_0x18 | 8;
      pIVar11 = IR::Instr::New(Ld_A,local_58->m_src1,&this_01->super_Opnd,local_58->m_func);
      IR::Instr::InsertBefore(local_58,pIVar11);
      IR::Instr::SetByteCodeOffset(pIVar11,local_58);
      IR::Instr::ReplaceSrc1(local_58,&this_01->super_Opnd);
      pRVar16 = IR::Opnd::AsRegOpnd(pIVar11->m_dst);
      pRVar16->field_0x18 = pRVar16->field_0x18 | 8;
      newSrc = this_01;
      src1Opnd = this_02;
      goto LAB_003f9b98;
    }
  }
  if (local_68 != (Instr *)0x0) {
    bVar4 = (bool)((bVar1 & 8) >> 3);
    pBVar18 = IR::Instr::AsBranchInstr(pIVar12);
    InsertInlineeOnFLowEdge
              ((FlowGraph *)(ulong)bVar4,pBVar18,local_68,this_00,local_88,local_4c,bVar4,
               origBranchSrcSymId);
  }
  pRVar16 = IR::Opnd::AsRegOpnd(instr->m_dst);
  if ((pRVar16->m_sym->field_0x19 & 0x20) != 0) {
    pBVar18 = IR::Instr::AsBranchInstr(pIVar12);
    if (pBVar18->m_byteCodeReg != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar15 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xb73,"(!instrBr->AsBranchInstr()->HasByteCodeReg())",
                         "!instrBr->AsBranchInstr()->HasByteCodeReg()");
      if (!bVar4) {
LAB_003f9f4d:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar15 = 0;
    }
    pRVar16 = IR::Opnd::AsRegOpnd(instr->m_dst);
    pSVar13 = pRVar16->m_sym;
    pBVar18 = IR::Instr::AsBranchInstr(pIVar12);
    RVar8 = StackSym::GetByteCodeRegSlot(pSVar13);
    pBVar18->m_byteCodeReg = RVar8;
  }
  pOVar14 = IR::Opnd::Copy(local_40,this->func);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_b8,pOVar14,this->func,true);
  IR::Instr::Remove(instr);
  pBVar18 = IR::Instr::AsBranchInstr(pIVar12);
  pIVar17 = IR::Instr::GetNextRealInstrOrLabel(&pBVar18->m_branchTarget->super_Instr);
  while (pIVar17->m_opcode == Br) {
    pBVar18 = IR::Instr::AsBranchInstr(pIVar17);
    pIVar17 = IR::Instr::GetNextRealInstrOrLabel(&pBVar18->m_branchTarget->super_Instr);
  }
  if (pIVar17->m_opcode != Ld_A) goto LAB_003f9db8;
  pIVar11 = IR::Instr::GetNextRealInstrOrLabel(pIVar17);
  OVar6 = pIVar11->m_opcode;
  if ((local_68 == (Instr *)0x0) && (OVar6 == InlineeEnd)) {
    this_03 = IR::Instr::GetNextRealInstrOrLabel(pIVar11);
    OVar6 = this_03->m_opcode;
    inlineeEndInstr = pIVar11;
  }
  else {
    inlineeEndInstr = (Instr *)0x0;
    this_03 = pIVar11;
  }
  if (((((OVar6 & ~ExtendedOpcodePrefix) != BrFalse_A) ||
       (bVar4 = IR::Opnd::IsEqual(pIVar17->m_dst,this_03->m_src1), !bVar4)) ||
      (bVar4 = IR::Opnd::IsEqual(pOVar14,pIVar17->m_src1), !bVar4)) ||
     ((bVar4 = IR::Opnd::IsEqual(pIVar17->m_dst,*(Opnd **)((long)pIVar12 + 0x48)), bVar4 ||
      (bVar4 = IR::Opnd::IsEqual(pIVar17->m_dst,*(Opnd **)((long)pIVar12 + 0x50)), bVar4)))) {
LAB_003f9db6:
    pIVar12 = (Instr *)0x0;
  }
  else {
    uVar9 = IR::Instr::GetByteCodeOffset(pIVar17);
    uVar10 = IR::Instr::GetByteCodeOffset(pIVar12);
    if (uVar10 < uVar9) {
      pRVar16 = IR::Opnd::AsRegOpnd(pIVar17->m_dst);
      bVar4 = IR::Instr::HasSymUseInRange(pRVar16->m_sym,*(Instr **)((long)pIVar12 + 0x10),pIVar17);
      if (bVar4) goto LAB_003f9db6;
    }
    if (inlineeEndInstr != (Instr *)0x0) {
      local_88 = this_03->m_func;
      local_4c = IR::Instr::GetByteCodeOffset(this_03);
      pSVar13 = IR::Opnd::GetStackSym(this_03->m_src1);
      origBranchSrcSymId = (pSVar13->super_Sym).m_id;
    }
    if (OVar2 == BrTrue_A) {
      pIVar17 = IR::Instr::New(Ld_A,pIVar17->m_dst,&this_01->super_Opnd,
                               *(Func **)((long)pIVar12 + 0x20));
      IR::Instr::InsertBefore(pIVar12,pIVar17);
      IR::Instr::SetByteCodeOffset(pIVar17,pIVar12);
    }
    else {
      pIVar17 = IR::Instr::New(Ld_A,pIVar17->m_dst,&this_02->super_Opnd,
                               *(Func **)((long)pIVar12 + 0x20));
      IR::Instr::InsertBefore(pIVar12,pIVar17);
      IR::Instr::SetByteCodeOffset(pIVar17,pIVar12);
    }
    pRVar16 = IR::Opnd::AsRegOpnd(pIVar17->m_dst);
    pRVar16->field_0x18 = pRVar16->field_0x18 | 8;
    if ((OVar2 == BrTrue_A) == (OVar6 == BrTrue_A)) {
      pBVar18 = IR::Instr::AsBranchInstr(this_03);
      labelInstr = pBVar18->m_branchTarget;
    }
    else {
      labelInstr = IR::LabelInstr::New(Label,this_03->m_func,false);
      IR::Instr::SetByteCodeOffset(&labelInstr->super_Instr,this_03->m_next);
      IR::Instr::InsertAfter(this_03,&labelInstr->super_Instr);
    }
    pBVar18 = IR::Instr::AsBranchInstr(pIVar12);
    IR::BranchInstr::SetTarget(pBVar18,labelInstr);
    if (inlineeEndInstr != (Instr *)0x0) {
      pBVar18 = IR::Instr::AsBranchInstr(pIVar12);
      bVar4 = (bool)((bVar1 & 8) >> 3);
      InsertInlineeOnFLowEdge
                ((FlowGraph *)(ulong)bVar4,pBVar18,inlineeEndInstr,this_00,local_88,local_4c,bVar4,
                 origBranchSrcSymId);
    }
  }
LAB_003f9db8:
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_b8);
  return pIVar12;
}

Assistant:

IR::Instr *
FlowGraph::PeepCm(IR::Instr *instr)
{
    // Basic pattern, peep:
    //      t1 = CmEq a, b
    //      t2 = Ld_A t1
    //      BrTrue $L1, t2
    // Into:
    //      t1 = True
    //      t2 = True
    //      BrEq $L1, a, b
    //      t1 = False
    //      t2 = False
    //
    //  The true/false Ld_A's will most likely end up being dead-stores...

    //  Alternate Pattern
    //      t1= CmEq a, b
    //      BrTrue $L1, t1
    // Into:
    //      BrEq $L1, a, b

    Func *func = instr->m_func;

    // Find Ld_A
    IR::Instr *instrNext = instr->GetNextRealInstrOrLabel();
    IR::Instr *inlineeEndInstr = nullptr;
    IR::Instr *instrNew;
    IR::Instr *instrLd = nullptr, *instrLd2 = nullptr;
    IR::Instr *instrByteCode = instrNext;
    bool ldFound = false;
    IR::Opnd *brSrc = instr->GetDst();

    if (instrNext->m_opcode == Js::OpCode::Ld_A && instrNext->GetSrc1()->IsEqual(instr->GetDst()))
    {
        ldFound = true;
        instrLd = instrNext;
        brSrc = instrNext->GetDst();

        if (brSrc->IsEqual(instr->GetSrc1()) || brSrc->IsEqual(instr->GetSrc2()))
        {
            return nullptr;
        }

        instrNext = instrLd->GetNextRealInstrOrLabel();

        // Is there a second Ld_A?
        if (instrNext->m_opcode == Js::OpCode::Ld_A && instrNext->GetSrc1()->IsEqual(brSrc))
        {
            // We have:
            //      t1 = Cm
            //      t2 = t1     // ldSrc = t1
            //      t3 = t2     // ldDst = t3
            //      BrTrue/BrFalse t3

            instrLd2 = instrNext;
            brSrc = instrLd2->GetDst();
            instrNext = instrLd2->GetNextRealInstrOrLabel();
            if (brSrc->IsEqual(instr->GetSrc1()) || brSrc->IsEqual(instr->GetSrc2()))
            {
                return nullptr;
            }
        }
    }

    // Skip over InlineeEnd
    if (instrNext->m_opcode == Js::OpCode::InlineeEnd)
    {
        inlineeEndInstr = instrNext;
        instrNext = inlineeEndInstr->GetNextRealInstrOrLabel();
    }

    // Find BrTrue/BrFalse
    bool brIsTrue;
    if (instrNext->m_opcode == Js::OpCode::BrTrue_A)
    {
        brIsTrue = true;
    }
    else if (instrNext->m_opcode == Js::OpCode::BrFalse_A)
    {
        brIsTrue = false;
    }
    else
    {
        return nullptr;
    }

    IR::Instr *instrBr = instrNext;

    // Make sure we have:
    //      t1 = Ld_A
    //         BrTrue/BrFalse t1
    if (!instr->GetDst()->IsEqual(instrBr->GetSrc1()) && !brSrc->IsEqual(instrBr->GetSrc1()))
    {
        return nullptr;
    }

    //
    // We have a match.  Generate the new branch
    //

    // BrTrue/BrFalse t1
    // Keep a copy of the inliner func and the bytecode offset of the original BrTrue/BrFalse if we end up inserting a new branch out of the inlinee,
    // and sym id of t1 for proper restoration on a bailout before the branch.
    Func* origBrFunc = instrBr->m_func;
    uint32 origBrByteCodeOffset = instrBr->GetByteCodeOffset();
    uint32 origBranchSrcSymId = instrBr->GetSrc1()->GetStackSym()->m_id;
    bool origBranchSrcOpndIsJITOpt = instrBr->GetSrc1()->GetIsJITOptimizedReg();

    instrBr->Unlink();
    instr->InsertBefore(instrBr);
    instrBr->ClearByteCodeOffset();
    instrBr->SetByteCodeOffset(instr);
    instrBr->FreeSrc1();
    instrBr->SetSrc1(instr->UnlinkSrc1());
    instrBr->SetSrc2(instr->UnlinkSrc2());
    instrBr->m_func = instr->m_func;

    Js::OpCode newOpcode = Js::OpCode::InvalidOpCode;

    switch(instr->m_opcode)
    {
    case Js::OpCode::CmEq_A:
        newOpcode = Js::OpCode::BrEq_A;
        break;
    case Js::OpCode::CmGe_A:
        newOpcode = Js::OpCode::BrGe_A;
        break;
    case Js::OpCode::CmGt_A:
        newOpcode = Js::OpCode::BrGt_A;
        break;
    case Js::OpCode::CmLt_A:
        newOpcode = Js::OpCode::BrLt_A;
        break;
    case Js::OpCode::CmLe_A:
        newOpcode = Js::OpCode::BrLe_A;
        break;
    case Js::OpCode::CmUnGe_A:
        newOpcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::CmUnGt_A:
        newOpcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmUnLt_A:
        newOpcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::CmUnLe_A:
        newOpcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::CmNeq_A:
        newOpcode = Js::OpCode::BrNeq_A;
        break;
    case Js::OpCode::CmSrEq_A:
        newOpcode = Js::OpCode::BrSrEq_A;
        break;
    case Js::OpCode::CmSrNeq_A:
        newOpcode = Js::OpCode::BrSrNeq_A;
        break;
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    }

    instrBr->m_opcode = newOpcode;

    IR::AddrOpnd* trueOpnd = IR::AddrOpnd::New(func->GetScriptContextInfo()->GetTrueAddr(), IR::AddrOpndKindDynamicVar, func, true);
    IR::AddrOpnd* falseOpnd = IR::AddrOpnd::New(func->GetScriptContextInfo()->GetFalseAddr(), IR::AddrOpndKindDynamicVar, func, true);

    trueOpnd->SetValueType(ValueType::Boolean);
    falseOpnd->SetValueType(ValueType::Boolean);

    if (!brIsTrue)
    {
        instrBr->AsBranchInstr()->Invert();
    }

    if (ldFound)
    {
        // Split Ld_A into "Ld_A TRUE"/"Ld_A FALSE"
        if (brIsTrue)
        {
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), trueOpnd, instrBr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrBr->InsertBefore(instrNew);
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetDst(), trueOpnd, instrBr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrBr->InsertBefore(instrNew);

            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), falseOpnd, instrLd->m_func);
            instrLd->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrLd);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrLd->ReplaceSrc1(falseOpnd);

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(falseOpnd);

                instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd2->GetDst(), trueOpnd, instrBr->m_func);
                instrBr->InsertBefore(instrNew);
                instrNew->SetByteCodeOffset(instrBr);
                instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            }
        }
        else
        {
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), falseOpnd, instrBr->m_func);
            instrBr->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetDst(), falseOpnd, instrBr->m_func);
            instrBr->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrBr);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;

            instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd->GetSrc1(), trueOpnd, instrLd->m_func);
            instrLd->InsertBefore(instrNew);
            instrNew->SetByteCodeOffset(instrLd);
            instrLd->ReplaceSrc1(trueOpnd);
            instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(trueOpnd);
                instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd2->GetDst(), falseOpnd, instrBr->m_func);
                instrBr->InsertBefore(instrNew);
                instrNew->SetByteCodeOffset(instrBr);
                instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
            }
        }
    }

    // Fix InlineeEnd
    if (inlineeEndInstr)
    {
        this->InsertInlineeOnFLowEdge(instrBr->AsBranchInstr(), inlineeEndInstr, instrByteCode , origBrFunc, origBrByteCodeOffset, origBranchSrcOpndIsJITOpt, origBranchSrcSymId);
    }

    if (instr->GetDst()->AsRegOpnd()->m_sym->HasByteCodeRegSlot())
    {
        Assert(!instrBr->AsBranchInstr()->HasByteCodeReg());
        StackSym *dstSym = instr->GetDst()->AsRegOpnd()->m_sym;
        instrBr->AsBranchInstr()->SetByteCodeReg(dstSym->GetByteCodeRegSlot());
    }

    brSrc = brSrc->Copy(this->func);
    // We need brSrc later, but instr->Remove() might delete it...
    IR::AutoReuseOpnd brSrcAutoCopy(brSrc, this->func, true);
    instr->Remove();

    //
    // Try optimizing through a second branch.
    // Peep:
    //
    //      t2 = True;
    //      BrTrue  $L1
    //      ...
    //   L1:
    //      t1 = Ld_A t2
    //      BrTrue  $L2
    //
    // Into:
    //      t2 = True;
    //      t1 = True;
    //      BrTrue  $L2 <---
    //      ...
    //   L1:
    //      t1 = Ld_A t2
    //      BrTrue  $L2
    //
    // This cleanup helps expose second level Cm peeps.

    IR::Instr *instrLd3 = instrBr->AsBranchInstr()->GetTarget()->GetNextRealInstrOrLabel();

    // Skip over branch to branch
    while (instrLd3->m_opcode == Js::OpCode::Br)
    {
        instrLd3 = instrLd3->AsBranchInstr()->GetTarget()->GetNextRealInstrOrLabel();
    }

    // Find Ld_A
    if (instrLd3->m_opcode != Js::OpCode::Ld_A)
    {
        return instrBr;
    }

    IR::Instr *instrBr2 = instrLd3->GetNextRealInstrOrLabel();
    IR::Instr *inlineeEndInstr2 = nullptr;

    // InlineeEnd?
    // REVIEW: Can we handle 2 inlineeEnds?
    if (instrBr2->m_opcode == Js::OpCode::InlineeEnd && !inlineeEndInstr)
    {
        inlineeEndInstr2 = instrBr2;
        instrBr2 = instrBr2->GetNextRealInstrOrLabel();
    }

    // Find branch
    bool brIsTrue2;
    if (instrBr2->m_opcode == Js::OpCode::BrTrue_A)
    {
        brIsTrue2 = true;
    }
    else if (instrBr2->m_opcode == Js::OpCode::BrFalse_A)
    {
        brIsTrue2 = false;
    }
    else
    {
        return nullptr;
    }

    // Make sure Ld_A operates on the right tmps.
    if (!instrLd3->GetDst()->IsEqual(instrBr2->GetSrc1()) || !brSrc->IsEqual(instrLd3->GetSrc1()))
    {
        return nullptr;
    }

    if (instrLd3->GetDst()->IsEqual(instrBr->GetSrc1()) || instrLd3->GetDst()->IsEqual(instrBr->GetSrc2()))
    {
        return nullptr;
    }

    // Make sure that the reg we're assigning to is not live in the intervening instructions (if this is a forward branch).
    if (instrLd3->GetByteCodeOffset() > instrBr->GetByteCodeOffset())
    {
        StackSym *symLd3 = instrLd3->GetDst()->AsRegOpnd()->m_sym;
        if (IR::Instr::HasSymUseInRange(symLd3, instrBr->m_next, instrLd3))
        {
            return nullptr;
        }
    }

    //
    // We have a match!
    //

    if(inlineeEndInstr2)
    {
        origBrFunc = instrBr2->m_func;
        origBrByteCodeOffset = instrBr2->GetByteCodeOffset();
        origBranchSrcSymId = instrBr2->GetSrc1()->GetStackSym()->m_id;
    }

    // Fix Ld_A
    if (brIsTrue)
    {
        instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd3->GetDst(), trueOpnd, instrBr->m_func);
        instrBr->InsertBefore(instrNew);
        instrNew->SetByteCodeOffset(instrBr);
        instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
    }
    else
    {
        instrNew = IR::Instr::New(Js::OpCode::Ld_A, instrLd3->GetDst(), falseOpnd, instrBr->m_func);
        instrBr->InsertBefore(instrNew);
        instrNew->SetByteCodeOffset(instrBr);
        instrNew->GetDst()->AsRegOpnd()->m_fgPeepTmp = true;
    }

    IR::LabelInstr *brTarget2;

    // Retarget branch
    if (brIsTrue2 == brIsTrue)
    {
        brTarget2 = instrBr2->AsBranchInstr()->GetTarget();
    }
    else
    {
        brTarget2 = IR::LabelInstr::New(Js::OpCode::Label, instrBr2->m_func);
        brTarget2->SetByteCodeOffset(instrBr2->m_next);
        instrBr2->InsertAfter(brTarget2);
    }

    instrBr->AsBranchInstr()->SetTarget(brTarget2);

    // InlineeEnd?
    if (inlineeEndInstr2)
    {
        this->InsertInlineeOnFLowEdge(instrBr->AsBranchInstr(), inlineeEndInstr2, instrByteCode, origBrFunc, origBrByteCodeOffset, origBranchSrcOpndIsJITOpt, origBranchSrcSymId);
    }

    return instrBr;
}